

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall
QTabBarPrivate::calculateFirstLastVisible(QTabBarPrivate *this,int index,bool visible,bool remove)

{
  int *piVar1;
  qsizetype qVar2;
  const_reference ppTVar3;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  QList<QTabBarPrivate::Tab_*> *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  long in_stack_ffffffffffffffc8;
  int local_24;
  int local_20;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    local_c = in_ESI;
    if (((in_CL & 1) != 0) || (in_ESI == *(int *)((long)&in_RDI[0x1d].d.ptr + 4))) {
      *(undefined4 *)((long)&in_RDI[0x1d].d.ptr + 4) = 0xffffffff;
      local_20 = 0;
      while( true ) {
        in_stack_ffffffffffffffc8 = (long)local_20;
        qVar2 = QList<QTabBarPrivate::Tab_*>::size
                          ((QList<QTabBarPrivate::Tab_*> *)&in_RDI[0x1e].d.ptr);
        if (qVar2 <= in_stack_ffffffffffffffc8) break;
        ppTVar3 = QList<QTabBarPrivate::Tab_*>::at(in_RDI,in_stack_ffffffffffffffc8);
        if (((byte)(*ppTVar3)->field_0xe4 >> 1 & 1) != 0) {
          *(int *)((long)&in_RDI[0x1d].d.ptr + 4) = local_20;
          break;
        }
        local_20 = local_20 + 1;
      }
    }
    if (((in_CL & 1) != 0) || (local_c == (int)in_RDI[0x1d].d.size)) {
      *(undefined4 *)&in_RDI[0x1d].d.size = 0xffffffff;
      qVar2 = QList<QTabBarPrivate::Tab_*>::size
                        ((QList<QTabBarPrivate::Tab_*> *)&in_RDI[0x1e].d.ptr);
      local_24 = (int)qVar2;
      do {
        local_24 = local_24 + -1;
        if (local_24 < 0) goto LAB_006adcb1;
        ppTVar3 = QList<QTabBarPrivate::Tab_*>::at(in_RDI,in_stack_ffffffffffffffc8);
      } while (((byte)(*ppTVar3)->field_0xe4 >> 1 & 1) == 0);
      *(int *)&in_RDI[0x1d].d.size = local_24;
    }
  }
  else {
    piVar1 = qMin<int>(&local_c,(int *)((long)&in_RDI[0x1d].d.ptr + 4));
    *(int *)((long)&in_RDI[0x1d].d.ptr + 4) = *piVar1;
    piVar1 = qMax<int>(&local_c,(int *)&in_RDI[0x1d].d.size);
    *(int *)&in_RDI[0x1d].d.size = *piVar1;
  }
LAB_006adcb1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::calculateFirstLastVisible(int index, bool visible, bool remove)
{
    if (visible) {
        firstVisible = qMin(index, firstVisible);
        lastVisible  = qMax(index, lastVisible);
    } else {
        if (remove || (index == firstVisible)) {
            firstVisible = -1;
            for (int i = 0; i < tabList.size(); ++i) {
                if (tabList.at(i)->visible) {
                    firstVisible = i;
                    break;
                }
            }
        }
        if (remove || (index == lastVisible)) {
            lastVisible = -1;
            for (int i = tabList.size() - 1; i >= 0; --i) {
                if (tabList.at(i)->visible) {
                    lastVisible = i;
                    break;
                }
            }
        }
    }
}